

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O2

int enet_protocol_dispatch_incoming_commands(ENetHost *host,ENetEvent *event)

{
  ENetList *pEVar1;
  ENetPeerState EVar2;
  ENetPeer *peer;
  _ENetListNode *p_Var3;
  _ENetListNode *p_Var4;
  ENetPacket *pEVar5;
  ENetListIterator result;
  
  pEVar1 = &host->dispatchQueue;
  do {
    while( true ) {
      peer = (ENetPeer *)(pEVar1->sentinel).next;
      if (peer == (ENetPeer *)pEVar1) {
        return 0;
      }
      p_Var3 = (peer->dispatchList).next;
      p_Var4 = (peer->dispatchList).previous;
      p_Var4->next = p_Var3;
      p_Var3->previous = p_Var4;
      peer->needsDispatch = 0;
      EVar2 = peer->state;
      if (EVar2 != ENET_PEER_STATE_CONNECTED) break;
      if ((peer->dispatchedCommands).sentinel.next != &(peer->dispatchedCommands).sentinel) {
        pEVar5 = enet_peer_receive(peer,&event->channelID);
        event->packet = pEVar5;
        if (pEVar5 != (ENetPacket *)0x0) {
          event->type = ENET_EVENT_TYPE_RECEIVE;
          event->peer = peer;
          if ((peer->dispatchedCommands).sentinel.next != &(peer->dispatchedCommands).sentinel) {
            peer->needsDispatch = 1;
            p_Var3 = (host->dispatchQueue).sentinel.previous;
            (peer->dispatchList).previous = p_Var3;
            (peer->dispatchList).next = &pEVar1->sentinel;
            p_Var3->next = (_ENetListNode *)peer;
            (host->dispatchQueue).sentinel.previous = (_ENetListNode *)peer;
          }
          return 1;
        }
      }
    }
    if (EVar2 - ENET_PEER_STATE_CONNECTION_PENDING < 2) {
      enet_peer_on_connect(peer);
      peer->state = ENET_PEER_STATE_CONNECTED;
      event->type = ENET_EVENT_TYPE_CONNECT;
      event->peer = peer;
      event->data = peer->eventData;
      return 1;
    }
  } while (EVar2 != ENET_PEER_STATE_ZOMBIE);
  host->recalculateBandwidthLimits = 1;
  event->type = ENET_EVENT_TYPE_DISCONNECT;
  event->peer = peer;
  event->data = peer->eventData;
  enet_peer_reset(peer);
  return 1;
}

Assistant:

static int enet_protocol_dispatch_incoming_commands(ENetHost* host, ENetEvent* event) {
	while (!enet_list_empty(&host->dispatchQueue)) {
		ENetPeer* peer = (ENetPeer*)enet_list_remove(enet_list_begin(&host->dispatchQueue));
		peer->needsDispatch = 0;

		switch (peer->state) {
		case ENET_PEER_STATE_CONNECTION_PENDING:
		case ENET_PEER_STATE_CONNECTION_SUCCEEDED:
			enet_protocol_change_state(host, peer, ENET_PEER_STATE_CONNECTED);

			event->type = ENET_EVENT_TYPE_CONNECT;
			event->peer = peer;
			event->data = peer->eventData;

			return 1;

		case ENET_PEER_STATE_ZOMBIE:
			host->recalculateBandwidthLimits = 1;
			event->type = ENET_EVENT_TYPE_DISCONNECT;
			event->peer = peer;
			event->data = peer->eventData;

			enet_peer_reset(peer);

			return 1;

		case ENET_PEER_STATE_CONNECTED:
			if (enet_list_empty(&peer->dispatchedCommands))
				continue;

			event->packet = enet_peer_receive(peer, &event->channelID);

			if (event->packet == NULL)
				continue;

			event->type = ENET_EVENT_TYPE_RECEIVE;
			event->peer = peer;

			if (!enet_list_empty(&peer->dispatchedCommands)) {
				peer->needsDispatch = 1;

				enet_list_insert(enet_list_end(&host->dispatchQueue), &peer->dispatchList);
			}

			return 1;

		default:
			break;
		}
	}

	return 0;
}